

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmldate.c
# Opt level: O3

datetime_t EBML_DateTime(ebml_date *Element)

{
  undefined1 auVar1 [16];
  int iVar2;
  bool_t bVar3;
  
  bVar3 = Node_IsPartOf(Element,0x54444245);
  if (bVar3 != 0) {
    if ((Element->Base).bValueIsSet == '\0') {
      iVar2 = 0;
    }
    else {
      auVar1 = SEXT816(0x112e0be826d694b3) * SEXT816(Element->Value);
      iVar2 = (int)(auVar1._8_8_ >> 0x1a) - (auVar1._12_4_ >> 0x1f);
    }
    return iVar2;
  }
  __assert_fail("Node_IsPartOf(Element,EBML_DATE_CLASS)",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmldate.c"
                ,0xb,"datetime_t EBML_DateTime(const ebml_date *)");
}

Assistant:

datetime_t EBML_DateTime(const ebml_date *Element)
{
    assert(Node_IsPartOf(Element,EBML_DATE_CLASS));
    if (!Element->Base.bValueIsSet)
        return 0;
    return (datetime_t)Scale32(Element->Value,1,1000000000); // nanoseconds to seconds
}